

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipm.cc
# Opt level: O0

void __thiscall ipx::IPM::AddCorrector(IPM *this,Step *step)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  double *pdVar7;
  Vector *pVVar8;
  valarray<double> *in_RSI;
  long in_RDI;
  Int j_2;
  Vector su;
  double *in_stack_00000188;
  double *in_stack_00000190;
  double *in_stack_00000198;
  Int j_1;
  Vector sl;
  double sigma;
  double ratio;
  Int j;
  Int num_finite;
  double muaff;
  double maxd;
  double maxp;
  double step_zu;
  double step_zl;
  double step_xu;
  double step_xl;
  double mu;
  Vector *dzu;
  Vector *dzl;
  Vector *dxu;
  Vector *dxl;
  Vector *zu;
  Vector *zl;
  Vector *xu;
  Vector *xl;
  Int n;
  Int m;
  Model *model;
  size_t in_stack_fffffffffffffd98;
  Iterate *in_stack_fffffffffffffda0;
  double in_stack_fffffffffffffdc8;
  Int *in_stack_fffffffffffffdd0;
  Vector *in_stack_fffffffffffffdd8;
  Vector *in_stack_fffffffffffffde0;
  int local_f4;
  valarray<double> local_f0 [2];
  int local_cc;
  valarray<double> local_c8;
  double local_b8;
  double local_b0;
  int local_a8;
  int local_a4;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  valarray<double> *local_60;
  valarray<double> *local_58;
  valarray<double> *local_50;
  valarray<double> *local_48;
  Vector *local_40;
  Vector *local_38;
  Vector *local_30;
  Vector *local_28;
  Int local_20;
  Int local_1c;
  Model *local_18;
  valarray<double> *local_10;
  
  local_10 = in_RSI;
  local_18 = Iterate::model(*(Iterate **)(in_RDI + 0x10));
  local_1c = Model::rows(local_18);
  local_20 = Model::cols(local_18);
  local_28 = Iterate::xl(*(Iterate **)(in_RDI + 0x10));
  local_30 = Iterate::xu(*(Iterate **)(in_RDI + 0x10));
  local_38 = Iterate::zl(*(Iterate **)(in_RDI + 0x10));
  local_40 = Iterate::zu(*(Iterate **)(in_RDI + 0x10));
  local_48 = local_10 + 1;
  local_50 = local_10 + 2;
  local_58 = local_10 + 4;
  local_60 = local_10 + 5;
  local_68 = Iterate::mu(in_stack_fffffffffffffda0);
  local_70 = StepToBoundary(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                            in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  local_78 = StepToBoundary(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                            in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  local_80 = StepToBoundary(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                            in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  local_88 = StepToBoundary(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                            in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  pdVar7 = std::min<double>(&local_70,&local_78);
  local_90 = *pdVar7;
  pdVar7 = std::min<double>(&local_80,&local_88);
  local_98 = *pdVar7;
  local_a0 = 0.0;
  local_a4 = 0;
  for (local_a8 = 0; local_a8 < local_20 + local_1c; local_a8 = local_a8 + 1) {
    bVar6 = Iterate::has_barrier_lb
                      (in_stack_fffffffffffffda0,(Int)(in_stack_fffffffffffffd98 >> 0x20));
    if (bVar6) {
      pdVar7 = std::valarray<double>::operator[](local_28,(long)local_a8);
      dVar5 = local_90;
      dVar1 = *pdVar7;
      pdVar7 = std::valarray<double>::operator[](local_48,(long)local_a8);
      dVar2 = *pdVar7;
      pdVar7 = std::valarray<double>::operator[](local_38,(long)local_a8);
      dVar4 = local_98;
      dVar3 = *pdVar7;
      pdVar7 = std::valarray<double>::operator[](local_58,(long)local_a8);
      local_a0 = (dVar5 * dVar2 + dVar1) * (dVar4 * *pdVar7 + dVar3) + local_a0;
      local_a4 = local_a4 + 1;
    }
    bVar6 = Iterate::has_barrier_ub
                      (in_stack_fffffffffffffda0,(Int)(in_stack_fffffffffffffd98 >> 0x20));
    if (bVar6) {
      pdVar7 = std::valarray<double>::operator[](local_30,(long)local_a8);
      dVar5 = local_90;
      dVar1 = *pdVar7;
      pdVar7 = std::valarray<double>::operator[](local_50,(long)local_a8);
      dVar2 = *pdVar7;
      pdVar7 = std::valarray<double>::operator[](local_40,(long)local_a8);
      dVar4 = local_98;
      dVar3 = *pdVar7;
      pdVar7 = std::valarray<double>::operator[](local_60,(long)local_a8);
      local_a0 = (dVar5 * dVar2 + dVar1) * (dVar4 * *pdVar7 + dVar3) + local_a0;
      local_a4 = local_a4 + 1;
    }
  }
  local_a0 = local_a0 / (double)local_a4;
  local_b0 = local_a0 / local_68;
  local_b8 = local_b0 * local_b0 * local_b0;
  std::valarray<double>::valarray
            ((valarray<double> *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  for (local_cc = 0; local_cc < local_20 + local_1c; local_cc = local_cc + 1) {
    bVar6 = Iterate::has_barrier_lb
                      (in_stack_fffffffffffffda0,(Int)(in_stack_fffffffffffffd98 >> 0x20));
    if (bVar6) {
      pdVar7 = std::valarray<double>::operator[](local_28,(long)local_cc);
      dVar1 = *pdVar7;
      pdVar7 = std::valarray<double>::operator[](local_38,(long)local_cc);
      dVar2 = *pdVar7;
      dVar5 = local_b8 * local_68;
      pdVar7 = std::valarray<double>::operator[](local_48,(long)local_cc);
      dVar3 = *pdVar7;
      pdVar7 = std::valarray<double>::operator[](local_58,(long)local_cc);
      dVar4 = *pdVar7;
      pdVar7 = std::valarray<double>::operator[](&local_c8,(long)local_cc);
      *pdVar7 = (-dVar1 * dVar2 + dVar5) - dVar3 * dVar4;
    }
    else {
      pdVar7 = std::valarray<double>::operator[](&local_c8,(long)local_cc);
      *pdVar7 = 0.0;
    }
  }
  std::valarray<double>::valarray
            ((valarray<double> *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  for (local_f4 = 0; local_f4 < local_20 + local_1c; local_f4 = local_f4 + 1) {
    bVar6 = Iterate::has_barrier_ub
                      (in_stack_fffffffffffffda0,(Int)(in_stack_fffffffffffffd98 >> 0x20));
    if (bVar6) {
      pdVar7 = std::valarray<double>::operator[](local_30,(long)local_f4);
      dVar1 = *pdVar7;
      pdVar7 = std::valarray<double>::operator[](local_40,(long)local_f4);
      dVar2 = *pdVar7;
      dVar5 = local_b8 * local_68;
      pdVar7 = std::valarray<double>::operator[](local_50,(long)local_f4);
      dVar3 = *pdVar7;
      pdVar7 = std::valarray<double>::operator[](local_60,(long)local_f4);
      dVar4 = *pdVar7;
      pdVar7 = std::valarray<double>::operator[](local_f0,(long)local_f4);
      *pdVar7 = (-dVar1 * dVar2 + dVar5) - dVar3 * dVar4;
    }
    else {
      pdVar7 = std::valarray<double>::operator[](local_f0,(long)local_f4);
      *pdVar7 = 0.0;
    }
  }
  pVVar8 = Iterate::rb(in_stack_fffffffffffffda0);
  std::valarray<double>::operator[](pVVar8,0);
  pVVar8 = Iterate::rc(in_stack_fffffffffffffda0);
  std::valarray<double>::operator[](pVVar8,0);
  pVVar8 = Iterate::rl(in_stack_fffffffffffffda0);
  std::valarray<double>::operator[](pVVar8,0);
  pVVar8 = Iterate::ru(in_stack_fffffffffffffda0);
  std::valarray<double>::operator[](pVVar8,0);
  std::valarray<double>::operator[](&local_c8,0);
  std::valarray<double>::operator[](local_f0,0);
  SolveNewtonSystem((IPM *)sigma,sl._M_data,(double *)sl._M_size,in_stack_00000198,in_stack_00000190
                    ,in_stack_00000188,_j,(Step *)muaff);
  std::valarray<double>::~valarray(local_10);
  std::valarray<double>::~valarray(local_10);
  return;
}

Assistant:

void IPM::AddCorrector(Step& step) {
    const Model& model = iterate_->model();
    const Int m = model.rows();
    const Int n = model.cols();
    const Vector& xl = iterate_->xl();
    const Vector& xu = iterate_->xu();
    const Vector& zl = iterate_->zl();
    const Vector& zu = iterate_->zu();
    const Vector& dxl = step.xl;
    const Vector& dxu = step.xu;
    const Vector& dzl = step.zl;
    const Vector& dzu = step.zu;
    const double mu = iterate_->mu();

    // Choose centering parameter.
    double step_xl = StepToBoundary(xl, dxl, nullptr);
    double step_xu = StepToBoundary(xu, dxu, nullptr);
    double step_zl = StepToBoundary(zl, dzl, nullptr);
    double step_zu = StepToBoundary(zu, dzu, nullptr);
    double maxp = std::min(step_xl, step_xu);
    double maxd = std::min(step_zl, step_zu);
    double muaff = 0.0;
    Int num_finite = 0;
    for (Int j = 0; j < n+m; j++) {
        if (iterate_->has_barrier_lb(j)) {
            assert(std::isfinite(xl[j]));
            assert(xl[j] != 0.0);
            muaff += (xl[j]+maxp*dxl[j]) * (zl[j]+maxd*dzl[j]);
            num_finite++;
        }
        if (iterate_->has_barrier_ub(j)) {
            assert(std::isfinite(xu[j]));
            assert(xu[j] != 0.0);
            muaff += (xu[j]+maxp*dxu[j]) * (zu[j]+maxd*dzu[j]);
            num_finite++;
        }
    }
    assert(std::isfinite(muaff));
    muaff /= num_finite;
    double ratio = muaff / mu;
    double sigma = ratio * ratio * ratio;

    // sl = -xl.*zl + sigma*mu - dxl.*dzl
    Vector sl(n+m);
    for (Int j = 0; j < n+m; j++)
        if (iterate_->has_barrier_lb(j))
            sl[j] = -xl[j]*zl[j] + sigma*mu - dxl[j]*dzl[j];
        else
            sl[j] = 0.0;
    assert(AllFinite(sl));

    // su = -xu.*zu + sigma*mu - dxu.*dzu
    Vector su(n+m);
    for (Int j = 0; j < n+m; j++)
        if (iterate_->has_barrier_ub(j))
            su[j] = -xu[j]*zu[j] + sigma*mu - dxu[j]*dzu[j];
        else
            su[j] = 0.0;
    assert(AllFinite(su));

    SolveNewtonSystem(&iterate_->rb()[0], &iterate_->rc()[0],
                      &iterate_->rl()[0], &iterate_->ru()[0], &sl[0], &su[0],
                      step);
}